

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

void __thiscall JSONNode::cast(JSONNode *this,char newtype)

{
  internalJSONNode *piVar1;
  byte bVar2;
  bool val;
  json_number val_00;
  allocator local_39;
  json_string local_38;
  
  piVar1 = this->internal;
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = type(this);
  if ((int)newtype == (uint)bVar2) {
    return;
  }
  switch((int)newtype) {
  case 0:
    nullify(this);
    break;
  case 1:
    as_string_abi_cxx11_(&local_38,this);
    operator=(this,&local_38);
    goto LAB_00112c20;
  case 2:
    val_00 = as_float(this);
    operator=(this,val_00);
    break;
  case 3:
    val = as_bool(this);
    operator=(this,val);
    break;
  case 4:
    as_array((JSONNode *)&local_38);
    goto LAB_00112be5;
  case 5:
    as_node((JSONNode *)&local_38);
LAB_00112be5:
    operator=(this,(JSONNode *)&local_38);
    ~JSONNode((JSONNode *)&local_38);
    break;
  default:
    std::__cxx11::string::string((string *)&local_38,"cast to unknown type",&local_39);
    JSONDebug::_JSON_FAIL(&local_38);
LAB_00112c20:
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void JSONNode::cast(char newtype) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (newtype == type()) return;

	   switch(newtype){
		  case JSON_NULL:
			 nullify();
			 return;
		  case JSON_STRING:
			 *this = as_string();
			 return;
		  case JSON_NUMBER:
			 *this = as_float();
			 return;
		  case JSON_BOOL:
			 *this = as_bool();
			 return;
		  case JSON_ARRAY:
			 *this = as_array();
			 return;
		  case JSON_NODE:
			 *this = as_node();
			 return;
	   }
	   JSON_FAIL(JSON_TEXT("cast to unknown type"));
    }